

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow.c
# Opt level: O3

int dmrC_dominates(dmr_C *C,pseudo_t pseudo,instruction *insn,instruction *dom,int local)

{
  uint uVar1;
  int iVar2;
  pseudo_t ppVar3;
  pseudo_t ppVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  uVar1 = *(uint *)dom;
  if (((char)uVar1 == '5') || (uVar8 = uVar1 & 0xff, uVar8 == 1)) {
    iVar5 = -(uint)(local == 0);
  }
  else {
    iVar5 = 0;
    if (0xfffffffd < uVar8 - 0x2b) {
      ppVar3 = (dom->field_6).field_4.phi_src;
      if (ppVar3 == pseudo) {
        uVar7 = (insn->field_6).field_5.offset;
        uVar6 = (dom->field_6).field_5.offset;
        if (((uVar7 != uVar6) || (iVar5 = 1, 0xff < (*(uint *)insn ^ uVar1))) &&
           (iVar5 = -1, uVar8 != 0x29)) {
          iVar2 = C->target->bits_in_char;
          uVar7 = uVar7 * iVar2;
          uVar6 = uVar6 * iVar2;
          if (((*(uint *)insn >> 8) + uVar7 <= uVar6) || (uVar6 + (uVar1 >> 8) <= uVar7)) {
            iVar5 = 0;
          }
        }
      }
      else if ((local == 0) &&
              (((ppVar4 = (insn->field_6).field_4.phi_src, ppVar4->type != PSEUDO_SYM ||
                (ppVar3->type != PSEUDO_SYM)) ||
               (iVar5 = 0, (ppVar4->field_5).sym == (ppVar3->field_5).sym)))) {
        iVar5 = -1;
      }
    }
  }
  return iVar5;
}

Assistant:

int dmrC_dominates(struct dmr_C *C, pseudo_t pseudo, struct instruction *insn, struct instruction *dom, int local)
{
	int opcode = dom->opcode;

	if (opcode == OP_CALL || opcode == OP_ENTRY)
		return local ? 0 : -1;
	if (opcode != OP_LOAD && opcode != OP_STORE)
		return 0;
	if (dom->src != pseudo) {
		if (local)
			return 0;
		/* We don't think two explicitly different symbols ever alias */
		if (distinct_symbols(insn->src, dom->src))
			return 0;
		/* We could try to do some alias analysis here */
		return -1;
	}
	if (!same_memop(insn, dom)) {
		// TODO I think I changed this to fix some simplification issue
		// http://marc.info/?l=linux-sparse&m=148966371314267&w=2
		if (dom->opcode == OP_LOAD)
			return -1;
		if (!overlapping_memop(C, insn, dom))
			return 0;
		return -1;
	}
	return 1;
}